

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::UInt64Size(RepeatedField<unsigned_long> *value)

{
  int iVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  undefined4 local_20;
  int i;
  int n;
  size_t out;
  RepeatedField<unsigned_long> *value_local;
  
  _i = 0;
  iVar1 = RepeatedField<unsigned_long>::size(value);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    puVar2 = RepeatedField<unsigned_long>::Get(value,local_20);
    sVar3 = UInt64Size(*puVar2);
    _i = sVar3 + _i;
  }
  return _i;
}

Assistant:

size_t WireFormatLite::UInt64Size(const RepeatedField<uint64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += UInt64Size(value.Get(i));
  }
  return out;
}